

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__expand_png_palette(stbi__png *a,stbi_uc *palette,int len,int pal_img_n)

{
  stbi_uc *psVar1;
  uint a_00;
  int iVar2;
  stbi_uc *psVar3;
  int n_1;
  int n;
  stbi_uc *orig;
  stbi_uc *temp_out;
  stbi_uc *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  int pal_img_n_local;
  int len_local;
  stbi_uc *palette_local;
  stbi__png *a_local;
  
  a_00 = a->s->img_x * a->s->img_y;
  psVar1 = a->out;
  psVar3 = (stbi_uc *)stbi__malloc_mad2(a_00,pal_img_n,0);
  if (psVar3 == (stbi_uc *)0x0) {
    a_local._4_4_ = stbi__err("Out of memory");
  }
  else {
    temp_out = psVar3;
    if (pal_img_n == 3) {
      for (p._4_4_ = 0; p._4_4_ < a_00; p._4_4_ = p._4_4_ + 1) {
        iVar2 = (uint)psVar1[p._4_4_] * 4;
        *temp_out = palette[iVar2];
        temp_out[1] = palette[iVar2 + 1];
        temp_out[2] = palette[iVar2 + 2];
        temp_out = temp_out + 3;
      }
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < a_00; p._4_4_ = p._4_4_ + 1) {
        iVar2 = (uint)psVar1[p._4_4_] * 4;
        *temp_out = palette[iVar2];
        temp_out[1] = palette[iVar2 + 1];
        temp_out[2] = palette[iVar2 + 2];
        temp_out[3] = palette[iVar2 + 3];
        temp_out = temp_out + 4;
      }
    }
    free(a->out);
    a->out = psVar3;
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int stbi__expand_png_palette(stbi__png *a, stbi_uc *palette, int len, int pal_img_n)
{
   stbi__uint32 i, pixel_count = a->s->img_x * a->s->img_y;
   stbi_uc *p, *temp_out, *orig = a->out;

   p = (stbi_uc *) stbi__malloc_mad2(pixel_count, pal_img_n, 0);
   if (p == NULL) return stbi__err("outofmem", "Out of memory");

   // between here and free(out) below, exitting would leak
   temp_out = p;

   if (pal_img_n == 3) {
      for (i=0; i < pixel_count; ++i) {
         int n = orig[i]*4;
         p[0] = palette[n  ];
         p[1] = palette[n+1];
         p[2] = palette[n+2];
         p += 3;
      }
   } else {
      for (i=0; i < pixel_count; ++i) {
         int n = orig[i]*4;
         p[0] = palette[n  ];
         p[1] = palette[n+1];
         p[2] = palette[n+2];
         p[3] = palette[n+3];
         p += 4;
      }
   }
   STBI_FREE(a->out);
   a->out = temp_out;

   STBI_NOTUSED(len);

   return 1;
}